

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkDataTypes.cpp
# Opt level: O0

void __thiscall HighFreqDataType::print(HighFreqDataType *this)

{
  ostream *poVar1;
  long in_RDI;
  
  std::operator<<((ostream *)&std::cout,"-Printing HighFreqDataType:\n");
  poVar1 = std::operator<<((ostream *)&std::cout,"  name: ");
  poVar1 = std::operator<<(poVar1,(string *)(in_RDI + 8));
  poVar1 = std::operator<<(poVar1,"\n  origin: ");
  poVar1 = std::operator<<(poVar1,(string *)(in_RDI + 0x28));
  poVar1 = std::operator<<(poVar1,"\n  dataFormat: ");
  poVar1 = std::operator<<(poVar1,(string *)(in_RDI + 0x48));
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"  SockAddress: ");
  std::operator<<(poVar1,(string *)(in_RDI + 0x68));
  std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void HighFreqDataType::print() {
    std::cout << "-Printing HighFreqDataType:\n";
    std::cout << "  name: " << name << "\n  origin: " << origin << "\n  dataFormat: " << dataFormat << std::endl;
    std::cout << "  SockAddress: " << sockAddr;
    std::cout << std::endl;
}